

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O2

void __thiscall TestOutput::printFileAndLineForFailure(TestOutput *this,TestFailure *failure)

{
  int lineNumber;
  SimpleString SStack_28;
  SimpleString local_20;
  
  (*failure->_vptr_TestFailure[2])(&SStack_28);
  lineNumber = (*failure->_vptr_TestFailure[5])(failure);
  printErrorInFileOnLineFormattedForWorkingEnvironment(this,&SStack_28,lineNumber);
  SimpleString::~SimpleString(&SStack_28);
  (*failure->_vptr_TestFailure[3])(&local_20,failure);
  printFailureInTest(this,&local_20);
  SimpleString::~SimpleString(&local_20);
  return;
}

Assistant:

void TestOutput::printFileAndLineForFailure(const TestFailure& failure)
{
    printErrorInFileOnLineFormattedForWorkingEnvironment(failure.getFileName(), failure.getFailureLineNumber());
    printFailureInTest(failure.getTestName());
}